

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall
bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::clear
          (Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this)

{
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *this_local;
  
  std::destroy_n<std::unique_ptr<bssl::ECHServerConfig,bssl::internal::Deleter>*,unsigned_long>
            (this->data_,this->size_);
  OPENSSL_free(this->data_);
  this->data_ = (unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  return;
}

Assistant:

void clear() {
    std::destroy_n(data_, size_);
    OPENSSL_free(data_);
    data_ = nullptr;
    size_ = 0;
    capacity_ = 0;
  }